

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall
Plan::RefreshDyndepDependents(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Node *node_00;
  Edge *this_00;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> dependents;
  _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  UnmarkDependents(this,node,(set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)&local_60);
  bVar9 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var2;
  if (!bVar9) {
    p_Var1 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      node_00 = *(Node **)(p_Var7 + 1);
      bVar5 = DependencyScan::RecomputeDirty(scan,node_00,err);
      bVar4 = true;
      if ((bVar5) && (bVar4 = false, node_00->dirty_ == true)) {
        this_00 = node_00->in_edge_;
        if ((this_00 == (Edge *)0x0) || (this_00->outputs_ready_ == true)) {
          __assert_fail("edge && !edge->outputs_ready()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                        ,0x272,
                        "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                       );
        }
        p_Var3 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
            p_Var3 = (&p_Var3->_M_left)[*(Edge **)(p_Var3 + 1) < this_00]) {
          if (*(Edge **)(p_Var3 + 1) >= this_00) {
            p_Var6 = p_Var3;
          }
        }
        p_Var8 = p_Var1;
        if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
           (p_Var8 = (_Rb_tree_header *)p_Var6,
           this_00 < (Edge *)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
          p_Var8 = p_Var1;
        }
        if (p_Var8 == p_Var1) {
          __assert_fail("want_e != want_.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                        ,0x274,
                        "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                       );
        }
        bVar4 = false;
        if (*(int *)(p_Var8 + 1) == 0) {
          *(undefined4 *)(p_Var8 + 1) = 1;
          this->wanted_edges_ = this->wanted_edges_ + 1;
          bVar5 = Edge::is_phony(this_00);
          if (!bVar5) {
            this->command_edges_ = this->command_edges_ + 1;
          }
        }
      }
      if (bVar4) break;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      bVar9 = (_Rb_tree_header *)p_Var7 == p_Var2;
    } while (!bVar9);
  }
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::~_Rb_tree(&local_60);
  return bVar9;
}

Assistant:

bool Plan::RefreshDyndepDependents(DependencyScan* scan, const Node* node,
                                   string* err) {
  // Collect the transitive closure of dependents and mark their edges
  // as not yet visited by RecomputeDirty.
  set<Node*> dependents;
  UnmarkDependents(node, &dependents);

  // Update the dirty state of all dependents and check if their edges
  // have become wanted.
  for (set<Node*>::iterator i = dependents.begin();
       i != dependents.end(); ++i) {
    Node* n = *i;

    // Check if this dependent node is now dirty.  Also checks for new cycles.
    if (!scan->RecomputeDirty(n, err))
      return false;
    if (!n->dirty())
      continue;

    // This edge was encountered before.  However, we may not have wanted to
    // build it if the outputs were not known to be dirty.  With dyndep
    // information an output is now known to be dirty, so we want the edge.
    Edge* edge = n->in_edge();
    assert(edge && !edge->outputs_ready());
    map<Edge*, Want>::iterator want_e = want_.find(edge);
    assert(want_e != want_.end());
    if (want_e->second == kWantNothing) {
      want_e->second = kWantToStart;
      EdgeWanted(edge);
    }
  }
  return true;
}